

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_loop_t *loop;
  uint local_734;
  int r;
  uint i;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t *once;
  uv_timer_t once_timers [10];
  
  uVar2 = uv_default_loop();
  start_time = uv_now(uVar2);
  if (start_time == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x62,"0 < start_time");
    abort();
  }
  for (local_734 = 0; local_734 < 10; local_734 = local_734 + 1) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&once_timers[(ulong)local_734 - 1].start_id);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
              ,0x68,"r == 0");
      abort();
    }
    iVar1 = uv_timer_start(&once_timers[(ulong)local_734 - 1].start_id,once_cb,local_734 * 0x32,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
              ,0x6a,"r == 0");
      abort();
    }
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&never.start_id);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x6f,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&never.start_id,repeat_cb,100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x71,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x75,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&r,never_cb,100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x77,"r == 0");
    abort();
  }
  iVar1 = uv_timer_stop(&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x79,"r == 0");
    abort();
  }
  uv_unref(&r);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (once_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x7e,"once_cb_called == 10");
    abort();
  }
  if (once_close_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x7f,"once_close_cb_called == 10");
    abort();
  }
  printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
  if (repeat_cb_called != 5) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x81,"repeat_cb_called == 5");
    abort();
  }
  if (repeat_close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x82,"repeat_close_cb_called == 1");
    abort();
  }
  uVar2 = uv_default_loop();
  lVar3 = uv_now(uVar2);
  if (lVar3 - start_time < 500) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x84,"500 <= uv_now(uv_default_loop()) - start_time");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x86,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT(r == 0);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT(r == 0);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT(r == 0);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT(r == 0);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT(r == 0);
  r = uv_timer_stop(&never);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(once_cb_called == 10);
  ASSERT(once_close_cb_called == 10);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT(repeat_cb_called == 5);
  ASSERT(repeat_close_cb_called == 1);

  ASSERT(500 <= uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY();
  return 0;
}